

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::interpolate_at_centroid
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  ContextType ctxType;
  char *__s;
  NotSupportedError *this;
  long lVar2;
  NegativeTestContext *this_00;
  undefined8 in_R8;
  DataType in_R9D;
  allocator<char> local_141;
  NegativeTestContext *local_140;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_140 = ctx;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"GL_OES_shader_multisample_interpolation",
               (allocator<char> *)&shaderSource);
    bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    if (!bVar1) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"This test requires a context version 3.2 or higher.",
                 "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_OES_shader_multisample_interpolation\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
                 ,0xff7);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_00 = local_140;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"interpolateAtCentroid",(allocator<char> *)&local_110);
  NegativeTestContext::beginSection(this_00,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(this_00,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,__s,&local_141);
      std::operator+(&shaderSource,"Verify shader: ",&local_110);
      NegativeTestContext::beginSection(this_00,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_110);
      if (lVar2 == 4) {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)this_00,
                   (NegativeTestContext *)(ulong)shaderType,0x1b,(ShaderFunction)in_R8,in_R9D);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(this_00,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        this_00 = local_140;
      }
      else {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)this_00,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,
                   (ShaderFunction)in_R8,in_R9D);
        std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
        verifyShader(this_00,shaderType,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)this_00,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_GEOMETRY,
                   (ShaderFunction)in_R8,in_R9D);
        std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
        verifyShader(this_00,shaderType,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)this_00,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_CONTROL,
                   (ShaderFunction)in_R8,in_R9D);
        std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
        verifyShader(this_00,shaderType,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceInterpolateAt_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)this_00,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_EVALUATION,
                   (ShaderFunction)in_R8,in_R9D);
        std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
        verifyShader(this_00,shaderType,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&shaderSource);
      }
      NegativeTestContext::endSection(this_00);
    }
  }
  NegativeTestContext::endSection(this_00);
  return;
}

Assistant:

void interpolate_at_centroid (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_OES_shader_multisample_interpolation"),
		"This test requires a context version 3.2 or higher.");

	ctx.beginSection("interpolateAtCentroid");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			if (s_shaders[shaderNdx] == glu::SHADERTYPE_FRAGMENT)
			{
				const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			else
			{
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT_VEC2));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT_VEC3));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceInterpolateAt(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_INTERPOLATED_AT_CENTROID, glu::TYPE_FLOAT_VEC4));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}